

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotStairsEx<ImPlot::GetterFuncPtr>(char *label_id,GetterFuncPtr *getter)

{
  GetterFuncPtr getter_00;
  GetterFuncPtr getter_01;
  GetterFuncPtr getter_02;
  GetterFuncPtr getter_03;
  bool bVar1;
  ImPlotScale IVar2;
  TransformerLogLog local_dc;
  _func_ImPlotPoint_void_ptr_int *local_d8;
  void *local_d0;
  undefined8 local_c8;
  TransformerLinLog local_bc;
  _func_ImPlotPoint_void_ptr_int *local_b8;
  void *local_b0;
  undefined8 local_a8;
  TransformerLogLin local_9c;
  _func_ImPlotPoint_void_ptr_int *local_98;
  void *local_90;
  undefined8 local_88;
  TransformerLinLin local_7c;
  _func_ImPlotPoint_void_ptr_int *local_78;
  void *local_70;
  undefined8 local_68;
  ImU32 local_5c;
  ImU32 local_58;
  ImU32 col_fill;
  ImU32 col_line_1;
  TransformerLogLin local_4c;
  TransformerLinLin local_48;
  ImU32 local_44;
  ImDrawList *pIStack_40;
  ImU32 col_line;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  ImPlotPoint p;
  int i;
  GetterFuncPtr *getter_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,0);
  if (bVar1) {
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (p.y._4_4_ = 0; p.y._4_4_ < getter->Count; p.y._4_4_ = p.y._4_4_ + 1) {
        _s = GetterFuncPtr::operator()(getter,p.y._4_4_);
        FitPoint((ImPlotPoint *)&s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_40 = GetPlotDrawList();
    if ((1 < getter->Count) && (((ulong)(DrawList->_TextureIdStack).Data & 0x100000000) != 0)) {
      local_44 = ImGui::GetColorU32((ImVec4 *)DrawList);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_48);
        RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLin>
                  (getter,&local_48,pIStack_40,*(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_4c);
        RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLin>
                  (getter,&local_4c,pIStack_40,*(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog((TransformerLinLog *)&col_line_1);
        RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLinLog>
                  (getter,(TransformerLinLog *)&col_line_1,pIStack_40,
                   *(float *)&DrawList->_IdxWritePtr,local_44);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog((TransformerLogLog *)&col_fill);
        RenderStairs<ImPlot::GetterFuncPtr,ImPlot::TransformerLogLog>
                  (getter,(TransformerLogLog *)&col_fill,pIStack_40,
                   *(float *)&DrawList->_IdxWritePtr,local_44);
      }
    }
    if (*(int *)((long)&DrawList->_IdxWritePtr + 4) != -1) {
      PopPlotClipRect();
      PushPlotClipRect((float)(DrawList->_ClipRectStack).Size);
      local_58 = ImGui::GetColorU32((ImVec4 *)&DrawList->VtxBuffer);
      local_5c = ImGui::GetColorU32((ImVec4 *)&DrawList->Flags);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        local_78 = getter->Getter;
        local_70 = getter->Data;
        local_68._0_4_ = getter->Count;
        local_68._4_4_ = getter->Offset;
        TransformerLinLin::TransformerLinLin(&local_7c);
        getter_00.Data = local_70;
        getter_00.Getter = local_78;
        getter_00.Count = (undefined4)local_68;
        getter_00.Offset = local_68._4_4_;
        RenderMarkers<ImPlot::TransformerLinLin,ImPlot::GetterFuncPtr>
                  (getter_00,local_7c,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 1:
        local_98 = getter->Getter;
        local_90 = getter->Data;
        local_88._0_4_ = getter->Count;
        local_88._4_4_ = getter->Offset;
        TransformerLogLin::TransformerLogLin(&local_9c);
        getter_01.Data = local_90;
        getter_01.Getter = local_98;
        getter_01.Count = (undefined4)local_88;
        getter_01.Offset = local_88._4_4_;
        RenderMarkers<ImPlot::TransformerLogLin,ImPlot::GetterFuncPtr>
                  (getter_01,local_9c,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 2:
        local_b8 = getter->Getter;
        local_b0 = getter->Data;
        local_a8._0_4_ = getter->Count;
        local_a8._4_4_ = getter->Offset;
        TransformerLinLog::TransformerLinLog(&local_bc);
        getter_02.Data = local_b0;
        getter_02.Getter = local_b8;
        getter_02.Count = (undefined4)local_a8;
        getter_02.Offset = local_a8._4_4_;
        RenderMarkers<ImPlot::TransformerLinLog,ImPlot::GetterFuncPtr>
                  (getter_02,local_bc,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
        break;
      case 3:
        local_d8 = getter->Getter;
        local_d0 = getter->Data;
        local_c8._0_4_ = getter->Count;
        local_c8._4_4_ = getter->Offset;
        TransformerLogLog::TransformerLogLog(&local_dc);
        getter_03.Data = local_d0;
        getter_03.Getter = local_d8;
        getter_03.Count = (undefined4)local_c8;
        getter_03.Offset = local_c8._4_4_;
        RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterFuncPtr>
                  (getter_03,local_dc,pIStack_40,
                   *(ImPlotMarker *)((long)&DrawList->_IdxWritePtr + 4),
                   (float)(DrawList->_ClipRectStack).Size,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 6) & 1),local_58,
                   (float)(DrawList->_ClipRectStack).Capacity,
                   (bool)(*(byte *)((long)&(DrawList->_TextureIdStack).Data + 7) & 1),local_5c);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

inline void PlotStairsEx(const char* label_id, const Getter& getter) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        if (FitThisFrame()) {
            for (int i = 0; i < getter.Count; ++i) {
                ImPlotPoint p = getter(i);
                FitPoint(p);
            }
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        if (getter.Count > 1 && s.RenderLine) {
            const ImU32 col_line    = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderStairs(getter, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderStairs(getter, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderStairs(getter, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderStairs(getter, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        // render markers
        if (s.Marker != ImPlotMarker_None) {
            PopPlotClipRect();
            PushPlotClipRect(s.MarkerSize);
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerOutline]);
            const ImU32 col_fill = ImGui::GetColorU32(s.Colors[ImPlotCol_MarkerFill]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderMarkers(getter, TransformerLinLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLin: RenderMarkers(getter, TransformerLogLin(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LinLog: RenderMarkers(getter, TransformerLinLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
                case ImPlotScale_LogLog: RenderMarkers(getter, TransformerLogLog(), DrawList, s.Marker, s.MarkerSize, s.RenderMarkerLine, col_line, s.MarkerWeight, s.RenderMarkerFill, col_fill); break;
            }
        }
        EndItem();
    }
}